

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int sock_free(BIO *bio)

{
  if (bio->shutdown != 0) {
    if (bio->init != 0) {
      close(bio->num);
    }
    bio->init = 0;
    bio->flags = 0;
  }
  return 1;
}

Assistant:

static int sock_free(BIO *bio) {
  if (bio->shutdown) {
    if (bio->init) {
      closesocket(bio->num);
    }
    bio->init = 0;
    bio->flags = 0;
  }
  return 1;
}